

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.cc
# Opt level: O0

Module __thiscall
tvm::runtime::GraphRuntimeCreate
          (runtime *this,string *sym_json,Module *m,
          vector<DLContext,_std::allocator<DLContext>_> *ctxs)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Module MVar1;
  shared_ptr<tvm::runtime::ModuleNode> local_68 [2];
  Module local_48;
  undefined1 local_38 [8];
  shared_ptr<tvm::runtime::GraphRuntime> exec;
  vector<DLContext,_std::allocator<DLContext>_> *ctxs_local;
  Module *m_local;
  string *sym_json_local;
  
  exec.super___shared_ptr<tvm::runtime::GraphRuntime,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ctxs;
  std::make_shared<tvm::runtime::GraphRuntime>();
  this_00 = std::
            __shared_ptr_access<tvm::runtime::GraphRuntime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<tvm::runtime::GraphRuntime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_38);
  Module::Module(&local_48,m);
  GraphRuntime::Init(this_00,sym_json,&local_48,
                     (vector<DLContext,_std::allocator<DLContext>_> *)
                     exec.super___shared_ptr<tvm::runtime::GraphRuntime,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
  Module::~Module(&local_48);
  std::shared_ptr<tvm::runtime::ModuleNode>::shared_ptr<tvm::runtime::GraphRuntime,void>
            (local_68,(shared_ptr<tvm::runtime::GraphRuntime> *)local_38);
  Module::Module((Module *)this,local_68);
  std::shared_ptr<tvm::runtime::ModuleNode>::~shared_ptr(local_68);
  std::shared_ptr<tvm::runtime::GraphRuntime>::~shared_ptr
            ((shared_ptr<tvm::runtime::GraphRuntime> *)local_38);
  MVar1.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  MVar1.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Module)MVar1.node_.
                 super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Module GraphRuntimeCreate(const std::string &sym_json,
                          const tvm::runtime::Module &m,
                          const std::vector<TVMContext> &ctxs) {
  std::shared_ptr<GraphRuntime> exec = std::make_shared<GraphRuntime>();
  exec->Init(sym_json, m, ctxs);
  return Module(exec);
}